

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall
QSplitterPrivate::doMove
          (QSplitterPrivate *this,bool backwards,int hPos,int index,int delta,bool mayCollapse,
          int *positions,int *widths)

{
  Orientation OVar1;
  undefined4 uVar2;
  QSplitterLayoutStruct **ppQVar3;
  QSplitterLayoutStruct *pQVar4;
  QWidget *w;
  int iVar5;
  ulong uVar6;
  Representation RVar7;
  ulong uVar8;
  undefined8 uVar9;
  QSize QVar10;
  int iVar11;
  Representation RVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  
  uVar16 = (uint)mayCollapse;
  if (-1 < index) {
    iVar13 = -delta;
    if (!backwards) {
      iVar13 = delta;
    }
    uVar8 = (this->list).d.size;
    uVar17 = (ulong)(uint)index;
    if (uVar17 < uVar8) {
      do {
        ppQVar3 = (this->list).d.ptr;
        while( true ) {
          index = index + iVar13;
          pQVar4 = ppQVar3[uVar17];
          w = pQVar4->widget;
          if ((w->data->widget_attributes & 0x10000) == 0) break;
          if (index < 0) {
            return;
          }
          uVar17 = (ulong)(uint)index;
          uVar16 = 1;
          if ((uVar17 < uVar8) &&
             (bVar14 = (byte)ppQVar3[uVar17]->field_0x14 >> 1 & 3, uVar16 = (uint)(bVar14 != 0),
             bVar14 == 2)) {
            uVar16 = *(uint *)&this->field_0x2a4 >> 0x10 & 1;
          }
          if (uVar8 <= uVar17) {
            return;
          }
        }
        iVar11 = 0;
        if ((((pQVar4->handle->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
          OVar1 = this->orient;
          uVar9 = (**(code **)(*(long *)&pQVar4->handle->super_QWidget + 0x70))();
          iVar11 = (int)((ulong)uVar9 >> 0x20);
          if (OVar1 == Horizontal) {
            iVar11 = (int)uVar9;
          }
        }
        if (backwards) {
          uVar8._0_4_ = (pQVar4->rect).x1;
          uVar8._4_4_ = (pQVar4->rect).y1;
          uVar6 = uVar8 >> 0x20;
          if (this->orient == Horizontal) {
            uVar6 = uVar8;
          }
          iVar5 = hPos - (int)uVar6;
        }
        else {
          uVar2 = (pQVar4->rect).x2;
          iVar5 = (pQVar4->rect).y2.m_i;
          if (this->orient == Horizontal) {
            iVar5 = uVar2;
          }
          iVar5 = ((iVar5 - hPos) - iVar11) + 1;
        }
        if ((0 < iVar5) || (RVar12.m_i = 0, (((byte)uVar16 | pQVar4->field_0x14) & 1) == 0)) {
          QVar10 = qSmartMaxSize(w,(Alignment)0x0);
          RVar7 = QVar10.ht.m_i;
          if (this->orient == Horizontal) {
            RVar7 = QVar10.wd.m_i;
          }
          if (iVar5 < RVar7.m_i) {
            RVar7.m_i = iVar5;
          }
          QVar10 = qSmartMinSize(w);
          RVar12 = QVar10.ht.m_i;
          if (this->orient == Horizontal) {
            RVar12 = QVar10.wd.m_i;
          }
          if (RVar12.m_i < RVar7.m_i) {
            RVar12.m_i = RVar7.m_i;
          }
        }
        iVar15 = hPos - (iVar11 + RVar12.m_i);
        iVar5 = hPos - RVar12.m_i;
        if (!backwards) {
          iVar5 = iVar11 + hPos;
        }
        positions[uVar17] = iVar5;
        widths[uVar17] = RVar12.m_i;
        hPos = RVar12.m_i + iVar11 + hPos;
        if (backwards) {
          hPos = iVar15;
        }
        if (index < 0) {
          return;
        }
        uVar17 = (ulong)(uint)index;
        uVar16 = 1;
        if (uVar17 < (ulong)(this->list).d.size) {
          bVar14 = (byte)(this->list).d.ptr[uVar17]->field_0x14 >> 1 & 3;
          uVar16 = (uint)(byte)this->field_0x2a6;
          if (bVar14 != 2) {
            uVar16 = (uint)(bVar14 != 0);
          }
        }
        uVar8 = (this->list).d.size;
      } while (uVar17 < uVar8);
    }
  }
  return;
}

Assistant:

void QSplitterPrivate::doMove(bool backwards, int hPos, int index, int delta, bool mayCollapse,
                              int *positions, int *widths)
{
    if (index < 0 || index >= list.size())
        return;

#ifdef QSPLITTER_DEBUG
    qDebug() << "QSplitterPrivate::doMove" << backwards << hPos << index << delta << mayCollapse;
#endif

    QSplitterLayoutStruct *s = list.at(index);
    QWidget *w = s->widget;

    int nextId = backwards ? index - delta : index + delta;

    if (w->isHidden()) {
        doMove(backwards, hPos, nextId, delta, collapsible(nextId), positions, widths);
    } else {
        int hs =s->handle->isHidden() ? 0 : s->getHandleSize(orient);

        int  ws = backwards ? hPos - pick(s->rect.topLeft())
                 : pick(s->rect.bottomRight()) - hPos -hs + 1;
        if (ws > 0 || (!s->collapsed && !mayCollapse)) {
            ws = qMin(ws, pick(qSmartMaxSize(w)));
            ws = qMax(ws, pick(qSmartMinSize(w)));
        } else {
            ws = 0;
        }
        positions[index] = backwards ? hPos - ws : hPos + hs;
        widths[index] = ws;
        doMove(backwards, backwards ? hPos - ws - hs : hPos + hs + ws, nextId, delta,
               collapsible(nextId), positions, widths);
    }

}